

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
fmt::v7::
basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
get_id<char>(basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *this,basic_string_view<char> name)

{
  basic_string_view<char> rhs;
  basic_string_view<char> lhs;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *in_RDI;
  size_t i;
  named_arg_value<char> *named_args;
  char *in_stack_ffffffffffffff98;
  basic_string_view<char> *pbVar2;
  basic_string_view<char> *this_00;
  size_t in_stack_ffffffffffffffc0;
  ulong local_30;
  
  bVar1 = has_named_args(in_RDI);
  if (bVar1) {
    bVar1 = is_packed(in_RDI);
    if (bVar1) {
      pbVar2 = (basic_string_view<char> *)((in_RDI->field_1).values_ + -1);
    }
    else {
      pbVar2 = (basic_string_view<char> *)((in_RDI->field_1).values_ + -2);
    }
    this_00 = pbVar2;
    for (local_30 = 0; local_30 < pbVar2->size_; local_30 = local_30 + 1) {
      basic_string_view<char>::basic_string_view(this_00,in_stack_ffffffffffffff98);
      lhs.size_ = in_stack_ffffffffffffffc0;
      lhs.data_ = in_RDX;
      rhs.size_ = in_RSI;
      rhs.data_ = (char *)in_RDI;
      bVar1 = v7::operator==(lhs,rhs);
      if (bVar1) {
        return *(int *)(pbVar2->data_ + local_30 * 0x10 + 8);
      }
    }
  }
  return -1;
}

Assistant:

int get_id(basic_string_view<Char> name) const {
    if (!has_named_args()) return -1;
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return named_args.data[i].id;
    }
    return -1;
  }